

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

void __thiscall Js::RegSlotVariablesWalker::PopulateMembers(RegSlotVariablesWalker *this)

{
  DebuggerScope *this_00;
  DiagStackFrame *pDVar1;
  code *pcVar2;
  RegSlot location;
  PropertyId propertyId_00;
  byte bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  FunctionBody *this_01;
  undefined4 extraout_var_00;
  PropertyIdOnRegSlotsContainer *this_02;
  DebuggerScope *scope;
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar7;
  undefined4 *puVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined1 local_58 [8];
  DebuggerScopeProperty debuggerScopeProperty;
  RegSlot local_40;
  PropertyId local_3c;
  RegSlot reg;
  PropertyId propertyId;
  bool isConst;
  bool isInDeadZone;
  
  if ((this->super_VariableWalkerBase).pMembersList ==
      (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    iVar5 = (*((this->super_VariableWalkerBase).pFrame)->_vptr_DiagStackFrame[2])();
    this_01 = JavascriptFunction::GetFunctionBody
                        ((JavascriptFunction *)CONCAT44(extraout_var,iVar5));
    iVar5 = (*((this->super_VariableWalkerBase).pFrame)->_vptr_DiagStackFrame[0xe])();
    this_02 = FunctionProxy::
              GetAuxPtr<(Js::FunctionProxy::AuxPointerType)9,Js::PropertyIdOnRegSlotsContainer*>
                        ((FunctionProxy *)this_01);
    scope = VariableWalkerBase::GetScopeWhenHaltAtFormals(&this->super_VariableWalkerBase);
    if (this_02 != (PropertyIdOnRegSlotsContainer *)0x0) {
      if (this_02->formalsUpperBound == 0xffffffff) {
        debuggerScopeProperty.flags = 0xffffffff;
      }
      else {
        debuggerScopeProperty.flags = FunctionBody::MapRegSlot(this_01,this_02->formalsUpperBound);
      }
      pLVar7 = JsUtil::
               List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::New((ArenaAllocator *)CONCAT44(extraout_var_00,iVar5),4);
      (this->super_VariableWalkerBase).pMembersList = pLVar7;
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      for (reg = 0; reg < this_02->length; reg = reg + 1) {
        PropertyIdOnRegSlotsContainer::FetchItemAt(this_02,reg,this_01,&local_3c,&local_40);
        propertyId_00 = local_3c;
        location = local_40;
        propertyId._2_1_ = 0;
        propertyId._3_1_ = 0;
        this_00 = this->debuggerScope;
        if (this_00 == (DebuggerScope *)0x0) {
          local_58 = (undefined1  [8])((ulong)local_58 & 0xffffffffffffff00);
          bVar4 = VariableWalkerBase::IsPropertyValid
                            (&this->super_VariableWalkerBase,local_3c,local_40,(bool *)local_58,
                             (bool *)((long)&propertyId + 2),(bool *)((long)&propertyId + 3));
          bVar3 = local_58[0] ^ 1;
          if (!bVar4) {
            bVar3 = 0;
          }
        }
        else {
          iVar5 = VariableWalkerBase::GetAdjustedByteCodeOffset(&this->super_VariableWalkerBase);
          bVar3 = DebuggerScope::TryGetValidProperty
                            (this_00,propertyId_00,location,iVar5,(DebuggerScopeProperty *)local_58,
                             (bool *)((long)&propertyId + 3));
          if ((bool)bVar3) {
            propertyId._2_1_ = (byte)debuggerScopeProperty.location & 1;
          }
        }
        if ((bVar3 & 1) != 0) {
          bVar4 = VariableWalkerBase::IsInParamScope(scope,(this->super_VariableWalkerBase).pFrame);
          if (bVar4) {
            if (debuggerScopeProperty.flags == -1) {
              bVar3 = DebuggerScope::HasProperty(scope,local_3c);
            }
            else {
              bVar3 = local_40 <= (uint)debuggerScopeProperty.flags;
            }
          }
          else if (((this_01->field_0x17b & 4) == 0) &&
                  (bVar4 = DebuggerScope::HasProperty(scope,local_3c), bVar4)) {
            debuggerScopeProperty.location = 0;
            local_58 = (undefined1  [8])((ulong)local_58 & 0xffffffff00000000);
            DebuggerScope::TryGetProperty(scope,local_3c,local_40,(DebuggerScopeProperty *)local_58)
            ;
            if ((debuggerScopeProperty.location & 0x16) != 0) {
              bVar3 = 0;
            }
          }
        }
        if ((bVar3 & 1) != 0) {
          pDVar1 = (this->super_VariableWalkerBase).pFrame;
          iVar5 = (*pDVar1->_vptr_DiagStackFrame[5])(pDVar1,(ulong)local_40,0);
          if ((CONCAT44(extraout_var_01,iVar5) != 0) || (local_3c != 0x1cf)) {
            iVar6 = (*((this->super_VariableWalkerBase).pFrame)->_vptr_DiagStackFrame[10])();
            if (*(long *)(*(long *)(CONCAT44(extraout_var_02,iVar6) + 8) + 0x4f8) ==
                CONCAT44(extraout_var_01,iVar5)) {
              propertyId._3_1_ = 1;
            }
            local_58 = (undefined1  [8])
                       VariableWalkerBase::AllocateNewPropertyDisplayInfo
                                 (&this->super_VariableWalkerBase,local_3c,(Var)(ulong)local_40,
                                  (bool)propertyId._2_1_,(bool)(propertyId._3_1_ & 1));
            if (local_58 == (undefined1  [8])0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar8 = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                          ,0x2fb,"(info != nullptr)","info != nullptr");
              if (!bVar4) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              *puVar8 = 0;
            }
            JsUtil::
            List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Add((this->super_VariableWalkerBase).pMembersList,
                  (DebuggerPropertyDisplayInfo **)local_58);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void RegSlotVariablesWalker::PopulateMembers()
    {
        if (pMembersList == nullptr)
        {
            Js::FunctionBody *pFBody = pFrame->GetJavascriptFunction()->GetFunctionBody();
            ArenaAllocator *arena = pFrame->GetArena();

            PropertyIdOnRegSlotsContainer *propIdContainer = pFBody->GetPropertyIdOnRegSlotsContainer();

            DebuggerScope *formalScope = GetScopeWhenHaltAtFormals();

            // this container can be nullptr if there is no locals in current function.
            if (propIdContainer != nullptr)
            {
                RegSlot limit = propIdContainer->formalsUpperBound == Js::Constants::NoRegister ? Js::Constants::NoRegister : pFBody->MapRegSlot(propIdContainer->formalsUpperBound);

                pMembersList = JsUtil::List<DebuggerPropertyDisplayInfo *, ArenaAllocator>::New(arena);
                for (uint i = 0; i < propIdContainer->length; i++)
                {
                    Js::PropertyId propertyId;
                    RegSlot reg;
                    propIdContainer->FetchItemAt(i, pFBody, &propertyId, &reg);
                    bool shouldInsert = false;
                    bool isConst = false;
                    bool isInDeadZone = false;

                    if (this->debuggerScope)
                    {
                        DebuggerScopeProperty debuggerScopeProperty;
                        if (this->debuggerScope->TryGetValidProperty(propertyId, reg, GetAdjustedByteCodeOffset(), &debuggerScopeProperty, &isInDeadZone))
                        {
                            isConst = debuggerScopeProperty.IsConst();
                            shouldInsert = true;
                        }
                    }
                    else
                    {
                        bool isPropertyInDebuggerScope = false;
                        shouldInsert = IsPropertyValid(propertyId, reg, &isPropertyInDebuggerScope, &isConst, &isInDeadZone) && !isPropertyInDebuggerScope;
                    }

                    if (shouldInsert)
                    {
                        if (IsInParamScope(formalScope, pFrame))
                        {
                            if (limit != Js::Constants::NoRegister)
                            {
                                shouldInsert = reg <= limit;
                            }
                            else
                            {
                                shouldInsert = formalScope->HasProperty(propertyId);
                            }
                        }
                        else if (!pFBody->IsParamAndBodyScopeMerged() && formalScope->HasProperty(propertyId))
                        {
                            DebuggerScopeProperty prop;
                            prop.flags = DebuggerScopePropertyFlags_None;
                            prop.propId = 0;
                            formalScope->TryGetProperty(propertyId, reg, &prop);
                            if (prop.flags & DebuggerScopePropertyFlags_HasDuplicateInBody)
                            {
                                shouldInsert = false;
                            }
                        }
                    }

                    if (shouldInsert)
                    {
                        Var value = pFrame->GetRegValue(reg);

                        // If the user didn't supply an arguments object, a fake one will
                        // be created when evaluating LocalsWalker::ShouldInsertFakeArguments().
                        if (!(propertyId == PropertyIds::arguments && value == nullptr))
                        {
                            if (pFrame->GetScriptContext()->IsUndeclBlockVar(value))
                            {
                                isInDeadZone = true;
                            }

                            DebuggerPropertyDisplayInfo *info = AllocateNewPropertyDisplayInfo(
                                propertyId,
                                (Var)reg,
                                isConst,
                                isInDeadZone);

                            Assert(info != nullptr);
                            pMembersList->Add(info);
                        }
                    }
                }
            }
        }
    }